

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_things.cpp
# Opt level: O0

void R_DrawVoxel(FVector3 *globalpos,FAngle *viewangle,FVector3 *dasprpos,DAngle *dasprang,
                fixed_t daxscale,fixed_t dayscale,FVoxel *voxobj,lighttable_t *colormap,
                short *daumost,short *dadmost,int minslabz,int maxslabz,int flags)

{
  uint uVar1;
  short sVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  BYTE *vptr;
  int iVar6;
  int iVar7;
  fixed_t fVar8;
  fixed_t fVar9;
  fixed_t fVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  Fix FVar14;
  int iVar15;
  SDWORD SVar16;
  SDWORD SVar17;
  SDWORD SVar18;
  SDWORD SVar19;
  SDWORD SVar20;
  SDWORD SVar21;
  int in;
  int iVar22;
  int iVar23;
  SDWORD SVar24;
  int32_t iVar25;
  int iVar26;
  int iVar27;
  FVoxelMipLevel *pFVar28;
  kvxslab_t *pkVar29;
  byte bVar30;
  int iVar31;
  int iVar32;
  float fVar33;
  double dVar34;
  undefined8 uStack_510;
  ulong local_508;
  int local_4fc;
  ulong local_4f8;
  ulong local_4f0;
  SDWORD local_4e4;
  SDWORD local_4e0;
  SDWORD local_4dc;
  int local_4d8;
  int local_4d4;
  bool local_4cd;
  SDWORD local_4cc;
  DAngle *local_4c8;
  FAngle *local_4c0;
  int local_4b8;
  int local_4b4;
  int x_1;
  int z2_1;
  int z1_1;
  int xxr;
  int xxl;
  int xxx;
  int lxt;
  int stripwidth;
  int diff_1;
  int diff;
  fixed_t z2;
  fixed_t z1;
  int ztop;
  int zleng;
  BYTE *col;
  int32_t local_470;
  fixed_t l2;
  fixed_t l1;
  int t;
  short *xyoffs;
  BYTE *slabxoffs;
  BYTE oand32;
  BYTE oand16;
  fixed_t *pfStack_450;
  BYTE oand;
  fixed_t *ggyinc;
  fixed_t *ggxinc;
  fixed_t piv_z;
  fixed_t piv_y;
  fixed_t piv_x;
  angle_t viewang;
  fixed_t dasprz;
  fixed_t daspry;
  fixed_t dasprx;
  fixed_t globalposz;
  fixed_t globalposy;
  fixed_t globalposx;
  double centerxwidebig_f;
  double centerxwide_f;
  undefined4 local_400;
  int xdimenscale;
  int nytoofar;
  int nytooclose;
  int yplc [64];
  int z2a [64];
  int z1a [64];
  FVoxelMipLevel *mip;
  kvxslab_t *voxend;
  kvxslab_t *voxptr;
  int local_d8;
  int dagyinc;
  int dagxinc;
  int cbacky;
  int cbackx;
  int yi;
  int xi;
  int ye;
  int xe;
  int ys;
  int xs;
  int yoff;
  int yinc;
  int y2;
  int x2;
  int y1;
  int x1;
  int ny;
  int nx;
  int rx;
  int lx;
  int dazscale;
  int gystart;
  int gxstart;
  int cnt;
  int dayscalerecip;
  int daxscalerecip;
  int gyinc;
  int gxinc;
  int backy;
  int backx;
  fixed_t sprsinang;
  fixed_t sprcosang;
  fixed_t sinang;
  fixed_t cosang;
  int nxoff;
  int ggystart;
  int ggxstart;
  int syoff;
  int y;
  int x;
  int k;
  int j;
  int i;
  fixed_t dayscale_local;
  fixed_t daxscale_local;
  DAngle *dasprang_local;
  FVector3 *dasprpos_local;
  FAngle *viewangle_local;
  FVector3 *globalpos_local;
  
  x2 = 0;
  y2 = 0;
  yinc = 0;
  yoff = 0;
  xe = 0;
  ye = 0;
  cbackx = 0;
  cbacky = 0;
  xdimenscale = centerxwide * 0x834;
  local_400 = 0x3ff00000;
  uStack_510 = 0x3a7098;
  local_4c8 = dasprang;
  local_4c0 = viewangle;
  centerxwide_f._4_4_ = FloatToFixed(((double)centerxwide * YaspectMul) / 160.0);
  centerxwidebig_f = (double)centerxwide;
  _globalposy = centerxwidebig_f * 65536.0 * 65536.0 * 8.0;
  uStack_510 = 0x3a70f2;
  globalposz = xs_Fix<4>::ToFix((real64)(double)globalpos->X);
  uStack_510 = 0x3a7117;
  dasprx = xs_Fix<4>::ToFix((real64)(double)-globalpos->Y);
  uStack_510 = 0x3a713c;
  daspry = xs_Fix<8>::ToFix((real64)(double)-globalpos->Z);
  uStack_510 = 0x3a7153;
  dasprz = xs_Fix<4>::ToFix((real64)(double)dasprpos->X);
  uStack_510 = 0x3a7178;
  viewang = xs_Fix<4>::ToFix((real64)(double)-dasprpos->Y);
  uStack_510 = 0x3a719d;
  piv_x = xs_Fix<8>::ToFix((real64)(double)-dasprpos->Z);
  iVar6 = daxscale / 0x300;
  iVar7 = dayscale / 0x300;
  if ((0 < iVar6) && (0 < iVar7)) {
    uStack_510 = 0x3a71dc;
    piv_y = TAngle<float>::BAMs(local_4c0);
    uStack_510 = 0x3a71ee;
    fVar33 = TAngle<float>::Cos(local_4c0);
    uStack_510 = 0x3a71f7;
    fVar8 = FloatToFixed((double)fVar33);
    uStack_510 = 0x3a7209;
    fVar33 = TAngle<float>::Sin(local_4c0);
    uStack_510 = 0x3a721f;
    fVar9 = FloatToFixed((double)-fVar33);
    uStack_510 = 0x3a7231;
    dVar34 = TAngle<double>::Cos(local_4c8);
    uStack_510 = 0x3a7236;
    fVar10 = FloatToFixed(dVar34);
    iVar11 = fVar10 >> 2;
    uStack_510 = 0x3a7248;
    dVar34 = TAngle<double>::Sin(local_4c8);
    uStack_510 = 0x3a7264;
    fVar10 = FloatToFixed(-dVar34);
    iVar12 = fVar10 >> 2;
    uStack_510 = 0x3a7273;
    R_SetupDrawSlabC(colormap);
    uStack_510 = 0x3a7296;
    local_4cc = DMulScale6(dasprz - globalposz,fVar8 >> 2,viewang - dasprx,fVar9 >> 2);
    if (local_4cc < 1) {
      local_4cc = -local_4cc;
    }
    uStack_510 = 0x3a72b4;
    iVar13 = MIN<int>(iVar6,iVar7);
    uStack_510 = 0x3a72c1;
    k = DivScale6(local_4cc,iVar13);
    uStack_510 = 0x3a72d4;
    FVar14 = xs_Fix<13>::ToFix((real64)FocalLengthX);
    y = 0;
    while( true ) {
      local_4cd = false;
      if (FVar14 <= k) {
        local_4cd = y < voxobj->NumMips;
      }
      if (local_4cd == false) break;
      k = k >> 1;
      y = y + 1;
    }
    if (voxobj->NumMips <= y) {
      y = voxobj->NumMips + -1;
    }
    pFVar28 = voxobj->Mips + y;
    if (pFVar28->SlabData != (BYTE *)0x0) {
      bVar30 = (byte)y;
      iVar13 = minslabz >> (bVar30 & 0x1f);
      iVar15 = maxslabz >> (bVar30 & 0x1f);
      iVar7 = iVar7 << (bVar30 + 8 & 0x1f);
      uStack_510 = 0x3a73b1;
      local_4e0 = iVar7;
      fVar10 = FloatToFixed(BaseYaspectMul);
      uStack_510 = 0x3a73be;
      SVar16 = SafeDivScale16(local_4e0,fVar10);
      uStack_510 = 0x3a73f5;
      SVar17 = Scale((int)((double)(iVar6 << (bVar30 + 8 & 0x1f)) / YaspectMul),centerxwide_f._4_4_,
                     centerxwide << 9);
      uStack_510 = 0x3a7415;
      local_4dc = iVar7;
      SVar18 = MulScale16(centerxwide_f._4_4_,viewingrangerecip);
      uStack_510 = 0x3a742e;
      SVar18 = Scale(local_4dc,SVar18,centerxwide << 9);
      SVar20 = (SDWORD)(0x40000000 / (long)SVar17);
      SVar18 = (SDWORD)(0x40000000 / (long)SVar18);
      piv_z = (fixed_t)((pFVar28->Pivot).X * 256.0);
      ggxinc._4_4_ = (int)((pFVar28->Pivot).Y * 256.0);
      ggxinc._0_4_ = (int)((pFVar28->Pivot).Z * 256.0);
      uStack_510 = 0x3a74b7;
      SVar19 = MulScale16(globalposz - dasprz,SVar20);
      uStack_510 = 0x3a74ce;
      SVar20 = MulScale16(dasprx - viewang,SVar20);
      uStack_510 = 0x3a74e2;
      SVar21 = DMulScale10(SVar19,iVar11,SVar20,iVar12);
      iVar7 = SVar21 + piv_z >> 8;
      uStack_510 = 0x3a7501;
      SVar20 = DMulScale10(SVar20,iVar11,SVar19,-iVar12);
      in = SVar20 + ggxinc._4_4_ >> 8;
      uStack_510 = 0x3a7523;
      iVar22 = clamp<int>(iVar7,0,pFVar28->SizeX + -1);
      uStack_510 = 0x3a7540;
      iVar23 = clamp<int>(in,0,pFVar28->SizeY + -1);
      uStack_510 = 0x3a7551;
      SVar20 = MulScale14(SVar17,iVar11);
      uStack_510 = 0x3a755f;
      SVar17 = MulScale14(SVar17,iVar12);
      local_4d8 = dasprz - globalposz;
      uStack_510 = 0x3a758d;
      SVar19 = DMulScale18(piv_z,SVar20,ggxinc._4_4_,-SVar17);
      iVar11 = local_4d8 - SVar19;
      local_4d4 = viewang - dasprx;
      uStack_510 = 0x3a75c3;
      SVar19 = DMulScale18(ggxinc._4_4_,SVar20,piv_z,SVar17);
      iVar12 = local_4d4 - SVar19;
      uStack_510 = 0x3a75db;
      SVar19 = MulScale16(fVar8 >> 2,SVar18);
      uStack_510 = 0x3a75e9;
      SVar18 = MulScale16(fVar9 >> 2,SVar18);
      uStack_510 = 0x3a7625;
      SVar21 = DMulScale10(SVar17,SVar19,SVar20,-SVar18);
      uStack_510 = 0x3a7639;
      SVar17 = DMulScale10(SVar20,SVar19,SVar17,SVar18);
      iVar6 = daspry - piv_x;
      if (iVar6 < 1) {
        iVar6 = -iVar6;
      }
      SVar20 = SVar16;
      if (SVar16 < 1) {
        SVar20 = -SVar16;
      }
      if (iVar6 >> 10 < SVar20) {
        syoff = 0;
        ggxstart = 0;
        uStack_510 = 0x3a7687;
        iVar6 = MAX<int>(pFVar28->SizeX,pFVar28->SizeY);
        lVar5 = -((long)iVar6 * 8 + 0x17U & 0xfffffffffffffff0);
        ggyinc = (fixed_t *)((long)&local_508 + lVar5);
        pfStack_450 = ggyinc + (iVar6 + 1);
        for (k = 0; k <= iVar6; k = k + 1) {
          ggyinc[k] = syoff;
          syoff = SVar21 + syoff;
          pfStack_450[k] = ggxstart;
          ggxstart = SVar17 + ggxstart;
        }
        local_4e4 = daspry - piv_x;
        *(undefined8 *)((long)&uStack_510 + lVar5) = 0x3a7738;
        SVar20 = MulScale16(SVar16,0xe800);
        SVar16 = local_4e4;
        *(undefined8 *)((long)&uStack_510 + lVar5) = 0x3a7745;
        SVar16 = DivScale21(SVar16,SVar20);
        iVar31 = (int)ggxinc * 0x80;
        iVar6 = SVar21;
        if (SVar21 < 1) {
          iVar6 = -SVar21;
        }
        SVar20 = SVar17;
        if (SVar17 < 1) {
          SVar20 = -SVar17;
        }
        iVar6 = iVar6 + SVar20 >> 1;
        for (gystart = 0; gystart < 8; gystart = gystart + 1) {
          local_4f0 = (ulong)(uint)gystart;
          switch(local_4f0) {
          case 0:
            xe = 0;
            ye = 0;
            cbackx = 1;
            cbacky = 1;
            break;
          case 1:
            xe = pFVar28->SizeX + -1;
            ye = 0;
            cbackx = -1;
            cbacky = 1;
            break;
          case 2:
            xe = 0;
            ye = pFVar28->SizeY + -1;
            cbackx = 1;
            cbacky = -1;
            break;
          case 3:
            xe = pFVar28->SizeX + -1;
            ye = pFVar28->SizeY + -1;
            cbackx = -1;
            cbacky = -1;
            break;
          case 4:
            xe = 0;
            cbackx = 1;
            cbacky = 2;
            ye = iVar23;
            break;
          case 5:
            xe = pFVar28->SizeX + -1;
            cbackx = -1;
            cbacky = 2;
            ye = iVar23;
            break;
          case 6:
            ye = 0;
            cbackx = 2;
            cbacky = 1;
            xe = iVar22;
            break;
          case 7:
            cbackx = 2;
            cbacky = -1;
            ye = pFVar28->SizeY + -1;
            xe = iVar22;
          }
          if (gystart < 4) {
            if ((((-1 < cbackx) || (iVar22 < xe)) && ((cbackx < 1 || (xe < iVar22)))) &&
               (((-1 < cbacky || (iVar23 < ye)) &&
                ((yi = iVar23, xi = iVar22, cbacky < 1 || (ye < iVar23)))))) {
LAB_003a7a6c:
              *(undefined8 *)((long)&uStack_510 + lVar5) = 0x3a7a7c;
              local_4fc = ksgn(ye - in);
              *(undefined8 *)((long)&uStack_510 + lVar5) = 0x3a7a92;
              SVar20 = ksgn(xe - iVar7);
              uVar1 = local_4fc + 4 + SVar20 * 3;
              local_4f8 = (ulong)uVar1;
              switch(local_4f8) {
              case 0:
              case 3:
                y2 = -SVar21;
                x2 = SVar17;
                break;
              case 1:
              case 2:
                x2 = SVar21 + SVar17;
                y2 = SVar17 - SVar21;
                break;
              case 5:
              case 8:
                y2 = SVar17;
                x2 = SVar21;
                break;
              case 6:
              case 7:
                x2 = 0;
                y2 = 0;
              }
              local_508 = (ulong)uVar1;
              switch(local_508) {
              case 0:
              case 1:
                yoff = SVar17;
                yinc = SVar21;
                break;
              case 2:
              case 5:
                yinc = 0;
                yoff = 0;
                break;
              case 3:
              case 6:
                yoff = SVar17 - SVar21;
                yinc = SVar21 + SVar17;
                break;
              case 7:
              case 8:
                yoff = -SVar21;
                yinc = SVar17;
              }
              slabxoffs._7_1_ = (char)(1 << (xe < iVar7)) + (char)(1 << (ye < in) + 2);
              slabxoffs._6_1_ = slabxoffs._7_1_ + 0x10;
              slabxoffs._5_1_ = slabxoffs._7_1_ + 0x20;
              if (cbacky < 1) {
                local_d8 = -SVar21;
                *(undefined8 *)((long)&uStack_510 + lVar5) = 0x3a7c4d;
                SVar20 = MulScale16(SVar17,viewingrangerecip);
                voxptr._4_4_ = -SVar20;
              }
              else {
                *(undefined8 *)((long)&uStack_510 + lVar5) = 0x3a7c29;
                voxptr._4_4_ = MulScale16(SVar17,viewingrangerecip);
                local_d8 = SVar21;
              }
              *(undefined8 *)((long)&uStack_510 + lVar5) = 0x3a7c73;
              SVar20 = MulScale16(yinc - x2,viewingrangerecip);
              *(undefined8 *)((long)&uStack_510 + lVar5) = 0x3a7c8a;
              x2 = MulScale16(x2,viewingrangerecip);
              iVar3 = pfStack_450[ye];
              iVar4 = ggyinc[ye];
              for (syoff = xe; syoff != xi; syoff = cbackx + syoff) {
                xyoffs = (short *)(pFVar28->SlabData + pFVar28->OffsetX[syoff]);
                _l1 = pFVar28->OffsetXY + syoff * (pFVar28->SizeY + 1);
                iVar26 = ggyinc[syoff];
                *(undefined8 *)((long)&uStack_510 + lVar5) = 0x3a7d4b;
                SVar24 = MulScale16((iVar12 * SVar19 - iVar11 * SVar18) + iVar3 + iVar26,
                                    viewingrangerecip);
                x1 = SVar24 + x2;
                y1 = ((iVar11 * SVar19 + iVar12 * SVar18) - iVar4) + pfStack_450[syoff];
                for (ggxstart = ye; ggxstart != yi; ggxstart = cbacky + ggxstart) {
                  if ((xdimenscale < y1) && (y1 < 0x3ff00000)) {
                    voxend = (kvxslab_t *)((long)xyoffs + (long)(int)_l1[ggxstart]);
                    pkVar29 = (kvxslab_t *)((long)xyoffs + (long)(int)_l1[ggxstart + 1]);
                    if (voxend < pkVar29) {
                      dVar34 = (double)x1 * centerxwidebig_f;
                      *(undefined8 *)((long)&uStack_510 + lVar5) = 0x3a7e2e;
                      iVar25 = xs_RoundToInt((real64)(dVar34 / (double)(y1 + y2)));
                      nx = iVar25 + centerx;
                      if (nx < 0) {
                        nx = 0;
                      }
                      dVar34 = (double)(x1 + SVar20) * centerxwidebig_f;
                      *(undefined8 *)((long)&uStack_510 + lVar5) = 0x3a7e7e;
                      iVar25 = xs_RoundToInt((real64)(dVar34 / (double)(y1 + yoff)));
                      ny = iVar25 + centerx;
                      if (viewwidth < ny) {
                        ny = viewwidth;
                      }
                      if (nx < ny) {
                        if ((flags & 4U) != 0) {
                          l2 = viewwidth - nx;
                          nx = viewwidth - ny;
                          ny = l2;
                        }
                        dVar34 = _globalposy / (double)(y1 - iVar6);
                        *(undefined8 *)((long)&uStack_510 + lVar5) = 0x3a7f22;
                        local_470 = xs_RoundToInt((real64)dVar34);
                        dVar34 = _globalposy / (double)(y1 + iVar6);
                        *(undefined8 *)((long)&uStack_510 + lVar5) = 0x3a7f49;
                        col._4_4_ = xs_RoundToInt((real64)dVar34);
                        for (; iVar25 = local_470, SVar24 = col._4_4_, voxend < pkVar29;
                            voxend = (kvxslab_t *)(voxend->col + (int)(uint)voxend->zleng)) {
                          _ztop = voxend->col;
                          z1 = (fixed_t)voxend->zleng;
                          z2 = (fixed_t)voxend->ztop;
                          if (z2 < iVar13) {
                            stripwidth = iVar13 - z2;
                            _ztop = _ztop + stripwidth;
                            z1 = z1 - stripwidth;
                            z2 = iVar13;
                          }
                          if (iVar15 < z2 + z1) {
                            lxt = (z2 + z1) - iVar15;
                            z1 = z1 - lxt;
                          }
                          if (0 < z1) {
                            iVar26 = z2 * 0x8000 - (SVar16 + iVar31);
                            if (iVar26 < 0) {
                              iVar27 = iVar26 + z1 * 0x8000;
                              if (iVar27 < 0) {
                                if ((voxend->backfacecull & slabxoffs._5_1_) != 0) {
                                  *(undefined8 *)((long)&uStack_510 + lVar5) = 0x3a808b;
                                  SVar24 = MulScale32(SVar24,iVar27);
                                  diff_1 = SVar24 + centery;
LAB_003a80d7:
                                  iVar25 = local_470;
                                  *(undefined8 *)((long)&uStack_510 + lVar5) = 0x3a80e5;
                                  SVar24 = MulScale32(iVar25,iVar26);
                                  diff = SVar24 + centery;
                                  goto LAB_003a8159;
                                }
                              }
                              else if ((voxend->backfacecull & slabxoffs._7_1_) != 0) {
                                *(undefined8 *)((long)&uStack_510 + lVar5) = 0x3a80c8;
                                SVar24 = MulScale32(iVar25,iVar27);
                                diff_1 = SVar24 + centery;
                                goto LAB_003a80d7;
                              }
                            }
                            else if ((voxend->backfacecull & slabxoffs._6_1_) != 0) {
                              *(undefined8 *)((long)&uStack_510 + lVar5) = 0x3a8122;
                              SVar24 = MulScale32(SVar24,iVar26);
                              iVar25 = local_470;
                              diff = SVar24 + centery;
                              iVar27 = z1 * 0x8000;
                              *(undefined8 *)((long)&uStack_510 + lVar5) = 0x3a814a;
                              SVar24 = MulScale32(iVar25,iVar26 + iVar27);
                              diff_1 = SVar24 + centery;
LAB_003a8159:
                              fVar8 = z1;
                              if (diff < diff_1) {
                                if (z1 == 1) {
                                  xs = 0;
                                }
                                else if (diff_1 - diff < 0x400) {
                                  xs = (int)(0xffffff / (long)(diff_1 - diff)) * z1 >> 8;
                                }
                                else {
                                  iVar26 = diff_1 - diff;
                                  *(undefined8 *)((long)&uStack_510 + lVar5) = 0x3a81ab;
                                  xs = SafeDivScale16(fVar8,iVar26);
                                }
                                *(undefined8 *)((long)&uStack_510 + lVar5) = 0x3a81ef;
                                xxx = MIN<int>(0x40,ny - nx);
                                xxl = nx;
                                while (xxl < ny) {
                                  for (xxr = 0; iVar26 = diff, xxr < xxx; xxr = xxr + 1) {
                                    if (z1 == 1) {
                                      (&nytoofar)[xxr] = 0;
                                      sVar2 = daumost[xxl + xxr];
                                      *(undefined8 *)((long)&uStack_510 + lVar5) = 0x3a826c;
                                      iVar26 = MAX<int>(iVar26,(int)sVar2);
                                      z2a[(long)xxr + 0x3e] = iVar26;
                                    }
                                    else if (diff < daumost[xxl + xxr]) {
                                      (&nytoofar)[xxr] = xs * (daumost[xxl + xxr] - diff);
                                      z2a[(long)xxr + 0x3e] = (int)daumost[xxl + xxr];
                                    }
                                    else {
                                      (&nytoofar)[xxr] = 0;
                                      z2a[(long)xxr + 0x3e] = diff;
                                    }
                                    iVar26 = diff_1;
                                    sVar2 = dadmost[xxl + xxr];
                                    *(undefined8 *)((long)&uStack_510 + lVar5) = 0x3a8347;
                                    iVar26 = MIN<int>(iVar26,(int)sVar2);
                                    yplc[(long)xxr + 0x3e] = iVar26;
                                  }
                                  z1_1 = 0;
                                  while (vptr = _ztop, z1_1 < xxx) {
                                    if (z2a[(long)z1_1 + 0x3e] < yplc[(long)z1_1 + 0x3e]) {
                                      x_1 = z2a[(long)z1_1 + 0x3e];
                                      local_4b4 = yplc[(long)z1_1 + 0x3e];
                                      z2_1 = z1_1;
                                      do {
                                        z2_1 = z2_1 + 1;
                                        if ((xxx <= z2_1) || (z2a[(long)z2_1 + 0x3e] != x_1)) break;
                                      } while (yplc[(long)z2_1 + 0x3e] == local_4b4);
                                      if ((flags & 1U) == 0) {
                                        iVar32 = z2_1 - z1_1;
                                        fVar8 = (&nytoofar)[z1_1];
                                        iVar27 = local_4b4 - x_1;
                                        iVar26 = ylookup[x_1] + xxl + z1_1;
                                        *(undefined8 *)((long)&uStack_510 + lVar5) = 0x3a84ac;
                                        R_DrawSlabC(iVar32,fVar8,iVar27,xs,vptr,dc_destorg + iVar26)
                                        ;
                                      }
                                      else {
                                        dc_yh = local_4b4 + -1;
                                        dc_count = local_4b4 - x_1;
                                        dc_iscale = xs;
                                        dc_yl = x_1;
                                        for (local_4b8 = z1_1; iVar27 = x_1, iVar26 = local_4b4,
                                            local_4b8 < z2_1; local_4b8 = local_4b8 + 1) {
                                          iVar32 = xxl + local_4b8;
                                          *(undefined8 *)((long)&uStack_510 + lVar5) = 0x3a8538;
                                          FCoverageBuffer::InsertSpan
                                                    (OffscreenCoverageBuffer,iVar32,iVar27,iVar26);
                                          if ((flags & 2U) == 0) {
                                            dc_x = xxl + local_4b8;
                                            *(undefined8 *)((long)&uStack_510 + lVar5) = 0x3a857c;
                                            rt_initcols(OffscreenColorBuffer +
                                                        (int)((dc_x & 0xfffffffcU) *
                                                             OffscreenBufferHeight));
                                            dc_source = _ztop;
                                            dc_texturefrac = (&nytoofar)[z1_1];
                                            *(undefined8 *)((long)&uStack_510 + lVar5) = 0x3a85ad;
                                            (*hcolfunc_pre)();
                                          }
                                        }
                                      }
                                      z1_1 = z2_1;
                                    }
                                    else {
                                      z1_1 = z1_1 + 1;
                                    }
                                  }
                                  xxl = xxl + 0x40;
                                  iVar26 = ny - xxl;
                                  *(undefined8 *)((long)&uStack_510 + lVar5) = 0x3a85ff;
                                  xxx = MIN<int>(0x40,iVar26);
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                  x1 = voxptr._4_4_ + x1;
                  y1 = y1 - local_d8;
                }
              }
            }
          }
          else if (((((-1 < cbackx) || (iVar22 <= xe)) && ((cbackx < 1 || (xe <= iVar22)))) &&
                   ((-1 < cbacky || (iVar23 <= ye)))) && ((cbacky < 1 || (ye <= iVar23)))) {
            yi = cbacky + iVar23;
            xi = cbackx + iVar22;
            goto LAB_003a7a6c;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void R_DrawVoxel(const FVector3 &globalpos, FAngle viewangle,
	const FVector3 &dasprpos, DAngle dasprang,
	fixed_t daxscale, fixed_t dayscale, FVoxel *voxobj,
	lighttable_t *colormap, short *daumost, short *dadmost, int minslabz, int maxslabz, int flags)
{
	int i, j, k, x, y, syoff, ggxstart, ggystart, nxoff;
	fixed_t cosang, sinang, sprcosang, sprsinang;
	int backx, backy, gxinc, gyinc;
	int daxscalerecip, dayscalerecip, cnt, gxstart, gystart, dazscale;
	int lx, rx, nx, ny, x1=0, y1=0, x2=0, y2=0, yinc=0;
	int yoff, xs=0, ys=0, xe, ye, xi=0, yi=0, cbackx, cbacky, dagxinc, dagyinc;
	kvxslab_t *voxptr, *voxend;
	FVoxelMipLevel *mip;
	int z1a[64], z2a[64], yplc[64];

	const int nytooclose = centerxwide * 2100, nytoofar = 32768*32768 - 1048576;
	const int xdimenscale = FLOAT2FIXED(centerxwide * YaspectMul / 160);
	const double centerxwide_f = centerxwide;
	const double centerxwidebig_f = centerxwide_f * 65536*65536*8;

	// Convert to Build's coordinate system.
	fixed_t globalposx = xs_Fix<4>::ToFix(globalpos.X);
	fixed_t globalposy = xs_Fix<4>::ToFix(-globalpos.Y);
	fixed_t globalposz = xs_Fix<8>::ToFix(-globalpos.Z);

	fixed_t dasprx = xs_Fix<4>::ToFix(dasprpos.X);
	fixed_t daspry = xs_Fix<4>::ToFix(-dasprpos.Y);
	fixed_t dasprz = xs_Fix<8>::ToFix(-dasprpos.Z);

	// Shift the scales from 16 bits of fractional precision to 6.
	// Also do some magic voodoo scaling to make them the right size.
	daxscale = daxscale / (0xC000 >> 6);
	dayscale = dayscale / (0xC000 >> 6);
	if (daxscale <= 0 || dayscale <= 0)
	{
		// won't be visible.
		return;
	}

	angle_t viewang = viewangle.BAMs();
	cosang = FLOAT2FIXED(viewangle.Cos()) >> 2;
	sinang = FLOAT2FIXED(-viewangle.Sin()) >> 2;
	sprcosang = FLOAT2FIXED(dasprang.Cos()) >> 2;
	sprsinang = FLOAT2FIXED(-dasprang.Sin()) >> 2;

	R_SetupDrawSlab(colormap);

	// Select mip level
	i = abs(DMulScale6(dasprx - globalposx, cosang, daspry - globalposy, sinang));
	i = DivScale6(i, MIN(daxscale, dayscale));
	j = xs_Fix<13>::ToFix(FocalLengthX);
	for (k = 0; i >= j && k < voxobj->NumMips; ++k)
	{
		i >>= 1;
	}
	if (k >= voxobj->NumMips) k = voxobj->NumMips - 1;

	mip = &voxobj->Mips[k];		if (mip->SlabData == NULL) return;

	minslabz >>= k;
	maxslabz >>= k;

	daxscale <<= (k+8); dayscale <<= (k+8);
	dazscale = FixedDiv(dayscale, FLOAT2FIXED(BaseYaspectMul));
	daxscale = fixed_t(daxscale / YaspectMul);
	daxscale = Scale(daxscale, xdimenscale, centerxwide << 9);
	dayscale = Scale(dayscale, FixedMul(xdimenscale, viewingrangerecip), centerxwide << 9);

	daxscalerecip = (1<<30) / daxscale;
	dayscalerecip = (1<<30) / dayscale;

	fixed_t piv_x = fixed_t(mip->Pivot.X*256.);
	fixed_t piv_y = fixed_t(mip->Pivot.Y*256.);
	fixed_t piv_z = fixed_t(mip->Pivot.Z*256.);

	x = FixedMul(globalposx - dasprx, daxscalerecip);
	y = FixedMul(globalposy - daspry, daxscalerecip);
	backx = (DMulScale10(x, sprcosang, y,  sprsinang) + piv_x) >> 8;
	backy = (DMulScale10(y, sprcosang, x, -sprsinang) + piv_y) >> 8;
	cbackx = clamp(backx, 0, mip->SizeX - 1);
	cbacky = clamp(backy, 0, mip->SizeY - 1);

	sprcosang = MulScale14(daxscale, sprcosang);
	sprsinang = MulScale14(daxscale, sprsinang);

	x = (dasprx - globalposx) - DMulScale18(piv_x, sprcosang, piv_y, -sprsinang);
	y = (daspry - globalposy) - DMulScale18(piv_y, sprcosang, piv_x,  sprsinang);

	cosang = FixedMul(cosang, dayscalerecip);
	sinang = FixedMul(sinang, dayscalerecip);

	gxstart = y*cosang - x*sinang;
	gystart = x*cosang + y*sinang;
	gxinc = DMulScale10(sprsinang, cosang, sprcosang, -sinang);
	gyinc = DMulScale10(sprcosang, cosang, sprsinang,  sinang);
	if ((abs(globalposz - dasprz) >> 10) >= abs(dazscale)) return;

	x = 0; y = 0; j = MAX(mip->SizeX, mip->SizeY);
	fixed_t *ggxinc = (fixed_t *)alloca((j + 1) * sizeof(fixed_t) * 2);
	fixed_t *ggyinc = ggxinc + (j + 1);
	for (i = 0; i <= j; i++)
	{
		ggxinc[i] = x; x += gxinc;
		ggyinc[i] = y; y += gyinc;
	}

	syoff = DivScale21(globalposz - dasprz, FixedMul(dazscale, 0xE800)) + (piv_z << 7);
	yoff = (abs(gxinc) + abs(gyinc)) >> 1;

	for (cnt = 0; cnt < 8; cnt++)
	{
		switch (cnt)
		{
			case 0: xs = 0;				ys = 0;				xi =  1; yi =  1; break;
			case 1: xs = mip->SizeX-1;	ys = 0;				xi = -1; yi =  1; break;
			case 2: xs = 0;				ys = mip->SizeY-1;	xi =  1; yi = -1; break;
			case 3: xs = mip->SizeX-1;	ys = mip->SizeY-1;	xi = -1; yi = -1; break;
			case 4: xs = 0;				ys = cbacky;		xi =  1; yi =  2; break;
			case 5: xs = mip->SizeX-1;	ys = cbacky;		xi = -1; yi =  2; break;
			case 6: xs = cbackx;		ys = 0;				xi =  2; yi =  1; break;
			case 7: xs = cbackx;		ys = mip->SizeY-1;	xi =  2; yi = -1; break;
		}
		xe = cbackx; ye = cbacky;
		if (cnt < 4)
		{
			if ((xi < 0) && (xe >= xs)) continue;
			if ((xi > 0) && (xe <= xs)) continue;
			if ((yi < 0) && (ye >= ys)) continue;
			if ((yi > 0) && (ye <= ys)) continue;
		}
		else
		{
			if ((xi < 0) && (xe > xs)) continue;
			if ((xi > 0) && (xe < xs)) continue;
			if ((yi < 0) && (ye > ys)) continue;
			if ((yi > 0) && (ye < ys)) continue;
			xe += xi; ye += yi;
		}

		i = ksgn(ys-backy)+ksgn(xs-backx)*3+4;
		switch(i)
		{
			case 6: case 7: x1 = 0;				y1 = 0;				break;
			case 8: case 5: x1 = gxinc;			y1 = gyinc;			break;
			case 0: case 3: x1 = gyinc;			y1 = -gxinc;		break;
			case 2: case 1: x1 = gxinc+gyinc;	y1 = gyinc-gxinc;	break;
		}
		switch(i)
		{
			case 2: case 5: x2 = 0;				y2 = 0;				break;
			case 0: case 1: x2 = gxinc;			y2 = gyinc;			break;
			case 8: case 7: x2 = gyinc;			y2 = -gxinc;		break;
			case 6: case 3: x2 = gxinc+gyinc;	y2 = gyinc-gxinc;	break;
		}
		BYTE oand = (1 << int(xs<backx)) + (1 << (int(ys<backy)+2));
		BYTE oand16 = oand + 16;
		BYTE oand32 = oand + 32;

		if (yi > 0) { dagxinc =  gxinc; dagyinc =  FixedMul(gyinc, viewingrangerecip); }
			   else { dagxinc = -gxinc; dagyinc = -FixedMul(gyinc, viewingrangerecip); }

			/* Fix for non 90 degree viewing ranges */
		nxoff = FixedMul(x2 - x1, viewingrangerecip);
		x1 = FixedMul(x1, viewingrangerecip);

		ggxstart = gxstart + ggyinc[ys];
		ggystart = gystart - ggxinc[ys];

		for (x = xs; x != xe; x += xi)
		{
			BYTE *slabxoffs = &mip->SlabData[mip->OffsetX[x]];
			short *xyoffs = &mip->OffsetXY[x * (mip->SizeY + 1)];

			nx = FixedMul(ggxstart + ggxinc[x], viewingrangerecip) + x1;
			ny = ggystart + ggyinc[x];
			for (y = ys; y != ye; y += yi, nx += dagyinc, ny -= dagxinc)
			{
				if ((ny <= nytooclose) || (ny >= nytoofar)) continue;
				voxptr = (kvxslab_t *)(slabxoffs + xyoffs[y]);
				voxend = (kvxslab_t *)(slabxoffs + xyoffs[y+1]);
				if (voxptr >= voxend) continue;

				lx = xs_RoundToInt(nx * centerxwide_f / (ny + y1)) + centerx;
				if (lx < 0) lx = 0;
				rx = xs_RoundToInt((nx + nxoff) * centerxwide_f / (ny + y2)) + centerx;
				if (rx > viewwidth) rx = viewwidth;
				if (rx <= lx) continue;

				if (flags & DVF_MIRRORED)
				{
					int t = viewwidth - lx;
					lx = viewwidth - rx;
					rx = t;
				}

				fixed_t l1 = xs_RoundToInt(centerxwidebig_f / (ny - yoff));
				fixed_t l2 = xs_RoundToInt(centerxwidebig_f / (ny + yoff));
				for (; voxptr < voxend; voxptr = (kvxslab_t *)((BYTE *)voxptr + voxptr->zleng + 3))
				{
					const BYTE *col = voxptr->col;
					int zleng = voxptr->zleng;
					int ztop = voxptr->ztop;
					fixed_t z1, z2;

					if (ztop < minslabz)
					{
						int diff = minslabz - ztop;
						ztop = minslabz;
						col += diff;
						zleng -= diff;
					}
					if (ztop + zleng > maxslabz)
					{
						int diff = ztop + zleng - maxslabz;
						zleng -= diff;
					}
					if (zleng <= 0) continue;

					j = (ztop << 15) - syoff;
					if (j < 0)
					{
						k = j + (zleng << 15);
						if (k < 0)
						{
							if ((voxptr->backfacecull & oand32) == 0) continue;
							z2 = MulScale32(l2, k) + centery;					/* Below slab */
						}
						else
						{
							if ((voxptr->backfacecull & oand) == 0) continue;	/* Middle of slab */
							z2 = MulScale32(l1, k) + centery;
						}
						z1 = MulScale32(l1, j) + centery;
					}
					else
					{
						if ((voxptr->backfacecull & oand16) == 0) continue;
						z1 = MulScale32(l2, j) + centery;						/* Above slab */
						z2 = MulScale32(l1, j + (zleng << 15)) + centery;
					}

					if (z2 <= z1) continue;

					if (zleng == 1)
					{
						yinc = 0;
					}
					else
					{
						if (z2-z1 >= 1024) yinc = FixedDiv(zleng, z2 - z1);
						else yinc = (((1 << 24) - 1) / (z2 - z1)) * zleng >> 8;
					}
					// [RH] Clip each column separately, not just by the first one.
					for (int stripwidth = MIN<int>(countof(z1a), rx - lx), lxt = lx;
						lxt < rx;
						(lxt += countof(z1a)), stripwidth = MIN<int>(countof(z1a), rx - lxt))
					{
						// Calculate top and bottom pixels locations
						for (int xxx = 0; xxx < stripwidth; ++xxx)
						{
							if (zleng == 1)
							{
								yplc[xxx] = 0;
								z1a[xxx] = MAX<int>(z1, daumost[lxt + xxx]);
							}
							else
							{
								if (z1 < daumost[lxt + xxx])
								{
									yplc[xxx] = yinc * (daumost[lxt + xxx] - z1);
									z1a[xxx] = daumost[lxt + xxx];
								}
								else
								{
									yplc[xxx] = 0;
									z1a[xxx] = z1;
								}
							}
							z2a[xxx] = MIN<int>(z2, dadmost[lxt + xxx]);
						}
						// Find top and bottom pixels that match and draw them as one strip
						for (int xxl = 0, xxr; xxl < stripwidth; )
						{
							if (z1a[xxl] >= z2a[xxl])
							{ // No column here
								xxl++;
								continue;
							}
							int z1 = z1a[xxl];
							int z2 = z2a[xxl];
							// How many columns share the same extents?
							for (xxr = xxl + 1; xxr < stripwidth; ++xxr)
							{
								if (z1a[xxr] != z1 || z2a[xxr] != z2)
									break;
							}

							if (!(flags & DVF_OFFSCREEN))
							{
								// Draw directly to the screen.
								R_DrawSlab(xxr - xxl, yplc[xxl], z2 - z1, yinc, col, ylookup[z1] + lxt + xxl + dc_destorg);
							}
							else
							{
								// Record the area covered and possibly draw to an offscreen buffer.
								dc_yl = z1;
								dc_yh = z2 - 1;
								dc_count = z2 - z1;
								dc_iscale = yinc;
								for (int x = xxl; x < xxr; ++x)
								{
									OffscreenCoverageBuffer->InsertSpan(lxt + x, z1, z2);
									if (!(flags & DVF_SPANSONLY))
									{
										dc_x = lxt + x;
										rt_initcols(OffscreenColorBuffer + (dc_x & ~3) * OffscreenBufferHeight);
										dc_source = col;
										dc_texturefrac = yplc[xxl];
										hcolfunc_pre();
									}
								}
							}
							xxl = xxr;
						}
					}
				}
			}
		}
	}
}